

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

depth_first_traverser * __thiscall
clipp::group::depth_first_traverser::operator++(depth_first_traverser *this)

{
  bool bVar1;
  reference pvVar2;
  pointer pcVar3;
  group *__args;
  depth_first_traverser *this_local;
  
  bVar1 = std::
          vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
          ::empty(&this->stack_);
  if (!bVar1) {
    pvVar2 = std::
             vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ::back(&this->stack_);
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
             ::operator->(&pvVar2->cur);
    bVar1 = child_t<clipp::parameter,_clipp::group>::is_group(pcVar3);
    if (bVar1) {
      pvVar2 = std::
               vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
               ::back(&this->stack_);
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
               ::operator->(&pvVar2->cur);
      __args = child_t<clipp::parameter,_clipp::group>::as_group(pcVar3);
      std::
      vector<clipp::group::depth_first_traverser::context,std::allocator<clipp::group::depth_first_traverser::context>>
      ::emplace_back<clipp::group_const&>
                ((vector<clipp::group::depth_first_traverser::context,std::allocator<clipp::group::depth_first_traverser::context>>
                  *)this,__args);
    }
    else {
      next_sibling(this);
    }
  }
  return this;
}

Assistant:

depth_first_traverser&
        operator ++ () {
            if(stack_.empty()) return *this;
            //at group -> decend into group
            if(stack_.back().cur->is_group()) {
                stack_.emplace_back(stack_.back().cur->as_group());
            }
            else {
                next_sibling();
            }
            return *this;
        }